

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void arimatest(void)

{
  int N_00;
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  double *xpred_00;
  double *amse_00;
  FILE *__stream;
  double *inp_00;
  arima_object obj_00;
  double temp2 [1200];
  double temp [1200];
  FILE *ifp;
  arima_object obj;
  double *amse;
  double *xpred;
  double *theta;
  double *phi;
  int q;
  int p;
  double *inp;
  int L;
  int d;
  int N;
  int i;
  
  __ptr = malloc(8);
  __ptr_00 = malloc(8);
  xpred_00 = (double *)malloc(0x28);
  amse_00 = (double *)malloc(0x28);
  __stream = fopen("../data/e6.dat","r");
  d = 0;
  if (__stream != (FILE *)0x0) {
    while (N_00 = d, iVar1 = feof(__stream), iVar1 == 0) {
      __isoc99_fscanf(__stream,"%lf %lf \n",temp2 + (long)d + 0x4af,temp2 + (long)d + -1);
      d = d + 1;
    }
    inp_00 = (double *)malloc((long)d << 3);
    for (d = 0; d < N_00; d = d + 1) {
      inp_00[d] = temp2[(long)d + 0x4af];
    }
    obj_00 = arima_init(1,0,1,N_00);
    arima_setMethod(obj_00,0);
    arima_setOptMethod(obj_00,7);
    arima_exec(obj_00,inp_00);
    arima_summary(obj_00);
    arima_predict(obj_00,inp_00,5,xpred_00,amse_00);
    printf("\n");
    printf("Predicted Values : ");
    for (d = 0; d < 5; d = d + 1) {
      printf("%g ",xpred_00[d]);
    }
    printf("\n");
    printf("Standard Errors  : ");
    for (d = 0; d < 5; d = d + 1) {
      sqrt(amse_00[d]);
      printf("%g ");
    }
    printf("\n");
    arima_free(obj_00);
    free(inp_00);
    free(__ptr);
    free(__ptr_00);
    free(xpred_00);
    free(amse_00);
    return;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

void arimatest() {
	int i, N, d, L;
	double *inp;
	int p, q;
	double *phi, *theta;
	double *xpred, *amse;
	arima_object obj;
	p = 1;
	d = 0;
	q = 1;


	L = 5;

	phi = (double*)malloc(sizeof(double)* p);
	theta = (double*)malloc(sizeof(double)* q);

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];
	double temp2[1200];

	ifp = fopen("../data/e6.dat", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf %lf \n", &temp[i],&temp2[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);
	//wmean = mean(temp, N);

	for (i = 0; i < N; ++i) {
		inp[i] = temp[i];
		//printf("%g \n",inp[i]);
	}


	obj = arima_init(p, d, q, N);
	arima_setMethod(obj, 0); // Method 0 ("MLE") is default so this step is unnecessary. The method also accepts values 1 ("CSS") and 2 ("Box-Jenkins")
	arima_setOptMethod(obj, 7);// Method 7 ("BFGS with More Thuente Line search") is default so this step is unnecessary. The method also accepts values 0,1,2,3,4,5,6. Check the documentation for details.
	arima_exec(obj, inp);
	arima_summary(obj);
	// Predict the next 5 values using the obtained ARIMA model
	arima_predict(obj, inp, L, xpred, amse);
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	arima_free(obj);
	free(inp);
	free(phi);
	free(theta);
	free(xpred);
	free(amse);
}